

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder_test.cpp
# Opt level: O0

void __thiscall forwarder::forwarder(forwarder *this,bool internal)

{
  string *psVar1;
  ulong uVar2;
  service *this_00;
  ostream *poVar3;
  undefined8 uVar4;
  char *pcVar5;
  runtime_error *this_01;
  byte in_SIL;
  long in_RDI;
  ostringstream oss;
  value settings;
  service *in_stack_fffffffffffffa18;
  __shared_ptr_access<cppcms::service,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffa20;
  service *in_stack_fffffffffffffa28;
  __shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffa30;
  application *in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa44;
  string local_468 [32];
  ostringstream local_448 [376];
  char local_2d0 [32];
  int local_2b0;
  undefined1 local_2a8 [15];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [36];
  undefined4 local_224;
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [47];
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [47];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  undefined1 local_e9;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [36];
  undefined4 local_8c;
  allocator local_79;
  string local_78 [39];
  allocator local_51;
  string local_50 [40];
  value local_28 [3];
  byte local_9;
  
  local_9 = in_SIL & 1;
  std::shared_ptr<cppcms::service>::shared_ptr((shared_ptr<cppcms::service> *)0x10bcbb);
  booster::intrusive_ptr<cppcms::application>::intrusive_ptr
            ((intrusive_ptr<cppcms::application> *)(in_RDI + 0x10));
  cppcms::json::value::value((value *)0x10bce3);
  cppcms::json::value::value<char[5]>
            ((value *)in_stack_fffffffffffffa30,(char (*) [5])in_stack_fffffffffffffa28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"service",&local_51);
  psVar1 = (string *)cppcms::json::value::operator[]((string *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"api",&local_79);
  cppcms::json::value::operator[](psVar1);
  cppcms::json::value::operator=
            ((value *)in_stack_fffffffffffffa20,(value *)in_stack_fffffffffffffa18);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  cppcms::json::value::~value((value *)0x10bdf7);
  local_8c = 0x1f90;
  cppcms::json::value::value<int>
            ((value *)in_stack_fffffffffffffa30,(int *)in_stack_fffffffffffffa28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"service",&local_b1);
  psVar1 = (string *)cppcms::json::value::operator[]((string *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"port",&local_d9);
  cppcms::json::value::operator[](psVar1);
  cppcms::json::value::operator=
            ((value *)in_stack_fffffffffffffa20,(value *)in_stack_fffffffffffffa18);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  cppcms::json::value::~value((value *)0x10bf15);
  local_e9 = 1;
  cppcms::json::value::value<bool>
            ((value *)in_stack_fffffffffffffa30,(bool *)in_stack_fffffffffffffa28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"service",&local_111);
  psVar1 = (string *)cppcms::json::value::operator[]((string *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"disable_global_exit_handling",&local_139);
  cppcms::json::value::operator[](psVar1);
  cppcms::json::value::operator=
            ((value *)in_stack_fffffffffffffa20,(value *)in_stack_fffffffffffffa18);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  cppcms::json::value::~value((value *)0x10c030);
  cppcms::json::value::value<char[6]>
            ((value *)in_stack_fffffffffffffa30,(char (*) [6])in_stack_fffffffffffffa28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"http",&local_169);
  psVar1 = (string *)cppcms::json::value::operator[]((string *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"script_names",&local_191);
  uVar2 = cppcms::json::value::operator[](psVar1);
  cppcms::json::value::operator[](uVar2);
  cppcms::json::value::operator=
            ((value *)in_stack_fffffffffffffa20,(value *)in_stack_fffffffffffffa18);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  cppcms::json::value::~value((value *)0x10c15d);
  if ((local_9 & 1) != 0) {
    cppcms::json::value::value<char[10]>
              ((value *)in_stack_fffffffffffffa30,(char (*) [10])in_stack_fffffffffffffa28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c0,"forwarding",&local_1c1);
    psVar1 = (string *)cppcms::json::value::operator[]((string *)local_28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e8,"rules",&local_1e9);
    uVar2 = cppcms::json::value::operator[](psVar1);
    psVar1 = (string *)cppcms::json::value::operator[](uVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_210,"ip",&local_211);
    cppcms::json::value::operator[](psVar1);
    cppcms::json::value::operator=
              ((value *)in_stack_fffffffffffffa20,(value *)in_stack_fffffffffffffa18);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    std::__cxx11::string::~string(local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    cppcms::json::value::~value((value *)0x10c304);
    local_224 = 0x1f91;
    cppcms::json::value::value<int>
              ((value *)in_stack_fffffffffffffa30,(int *)in_stack_fffffffffffffa28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"forwarding",&local_249);
    psVar1 = (string *)cppcms::json::value::operator[]((string *)local_28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_270,"rules",&local_271);
    uVar2 = cppcms::json::value::operator[](psVar1);
    psVar1 = (string *)cppcms::json::value::operator[](uVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_298,"port",&local_299);
    cppcms::json::value::operator[](psVar1);
    cppcms::json::value::operator=
              ((value *)in_stack_fffffffffffffa20,(value *)in_stack_fffffffffffffa18);
    std::__cxx11::string::~string(local_298);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    cppcms::json::value::~value((value *)0x10c497);
  }
  this_00 = (service *)operator_new(8);
  cppcms::service::service(this_00,local_28);
  std::__shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>::reset<cppcms::service>
            (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  if ((local_9 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Tesing application level forwarding");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    operator_new(0x28);
    std::__shared_ptr_access<cppcms::service,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              (in_stack_fffffffffffffa20);
    mini_forwarder::mini_forwarder
              ((mini_forwarder *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    booster::intrusive_ptr<cppcms::application>::operator=
              ((intrusive_ptr<cppcms::application> *)
               CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
               in_stack_fffffffffffffa38);
    std::__shared_ptr_access<cppcms::service,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cppcms::service,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x10c9f7);
    uVar4 = cppcms::service::applications_pool();
    booster::intrusive_ptr<cppcms::application>::intrusive_ptr
              ((intrusive_ptr<cppcms::application> *)in_stack_fffffffffffffa20,
               (intrusive_ptr<cppcms::application> *)in_stack_fffffffffffffa18);
    cppcms::applications_pool::mount(uVar4,local_2a8);
    booster::intrusive_ptr<cppcms::application>::~intrusive_ptr
              ((intrusive_ptr<cppcms::application> *)in_stack_fffffffffffffa20);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Tesing internal forwarder");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__shared_ptr_access<cppcms::service,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cppcms::service,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x10caef);
    pcVar5 = (char *)cppcms::service::forwarder();
    cppcms::forwarder::check_forwading_rules_abi_cxx11_(local_2d0,pcVar5,"127.0.0.1:8080");
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             *)0x10cb3f);
    if (local_2b0 != 0x1f91) {
      std::__cxx11::ostringstream::ostringstream(local_448);
      poVar3 = std::operator<<((ostream *)local_448,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/forwarder_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x50);
      std::operator<<(poVar3,
                      " srv->forwarder().check_forwading_rules(\"127.0.0.1:8080\",\"/test\",\"\").second==8081"
                     );
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(this_01,local_468);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  cppcms::json::value::~value((value *)0x10ccb8);
  return;
}

Assistant:

forwarder(bool internal)
	{
		cppcms::json::value settings;
		settings["service"]["api"]="http";
		settings["service"]["port"]=8080;
		settings["service"]["disable_global_exit_handling"]=true;
		settings["http"]["script_names"][0]="/test";
		if(internal) {
			settings["forwarding"]["rules"][0]["ip"]="127.0.0.1";
			settings["forwarding"]["rules"][0]["port"]=8081;
		}
		srv.reset(new cppcms::service(settings));

		if(!internal) {
			std::cout << "Tesing application level forwarding" << std::endl;
			app_=new mini_forwarder(*srv);
			srv->applications_pool().mount(app_);
		}
		else {
			std::cout << "Tesing internal forwarder" << std::endl;
			TEST(srv->forwarder().check_forwading_rules("127.0.0.1:8080","/test","").second==8081);
		}

	}